

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double lorentz_sample(int *seed)

{
  double dVar1;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = lorentz_cdf_inv(dVar1);
  return dVar1;
}

Assistant:

double lorentz_sample ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    LORENTZ_SAMPLE samples the Lorentz PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double LORENTZ_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = lorentz_cdf_inv ( cdf );

  return x;
}